

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::getStructBufferCounter
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *buffer)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name;
  mapped_type_conflict2 *pmVar4;
  TIntermTyped *pTVar5;
  TType local_100;
  TIntermTyped *local_68;
  TIntermTyped *counterMember;
  TIntermTyped *index;
  TIntermTyped *counterVar;
  TString counterBlockName;
  TIntermTyped *buffer_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if (buffer != (TIntermTyped *)0x0) {
    counterBlockName.field_2._8_8_ = buffer;
    iVar2 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar1 = isStructBufferType(this,(TType *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      plVar3 = (long *)(**(code **)(*(long *)counterBlockName.field_2._8_8_ + 0x60))();
      name = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*plVar3 + 400))();
      TIntermediate::
      addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
                ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 &counterVar,this_00,name);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
               ::operator[](&(this->structBufferCounter).
                             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                            ,(key_type *)&counterVar);
      *pmVar4 = true;
      index = handleVariable(this,loc,(TString *)&counterVar);
      counterMember =
           &TIntermediate::addConstantUnion
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,0,loc,false
                      )->super_TIntermTyped;
      pTVar5 = TIntermediate::addIndex
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpIndexDirectStruct,index,counterMember,loc);
      local_68 = pTVar5;
      TType::TType(&local_100,EbtUint,EvqTemporary,1,0,0,false);
      (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar5,&local_100);
      TType::~TType(&local_100);
      pTVar5 = local_68;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &counterVar);
      return pTVar5;
    }
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::getStructBufferCounter(const TSourceLoc& loc, TIntermTyped* buffer)
{
    // Bail out if not a struct buffer
    if (buffer == nullptr || ! isStructBufferType(buffer->getType()))
        return nullptr;

    const TString counterBlockName(intermediate.addCounterBufferName(buffer->getAsSymbolNode()->getName()));

    // Mark the counter as being used
    structBufferCounter[counterBlockName] = true;

    TIntermTyped* counterVar = handleVariable(loc, &counterBlockName);  // find the block structure
    TIntermTyped* index = intermediate.addConstantUnion(0, loc); // index to counter inside block struct

    TIntermTyped* counterMember = intermediate.addIndex(EOpIndexDirectStruct, counterVar, index, loc);
    counterMember->setType(TType(EbtUint));
    return counterMember;
}